

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

cargo_validation_t *
cargo_validate_choices(cargo_validate_choices_flags_t flags,cargo_type_t type,size_t count,...)

{
  int iVar1;
  uint uVar2;
  void *__ptr;
  char in_AL;
  cargo_validation_t *user;
  cargo_validation_t *__ptr_00;
  cargo_validation_destroy_f p_Var3;
  char *pcVar4;
  void **ppvVar5;
  cargo_validation_f p_Var6;
  cargo_free_f p_Var7;
  undefined8 in_RCX;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  cargo_validation_f p_Var10;
  undefined4 in_XMM0_Da;
  undefined4 uVar11;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  cargo_astr_t str;
  undefined8 local_128;
  void **local_120;
  cargo_astr_t local_108;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_108.offset = 0;
  local_108.diff = 0;
  local_108.s = (char **)0x0;
  local_108.l = 0;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((replaced_cargo_malloc == (cargo_malloc_f)0x0) ||
     (user = (cargo_validation_t *)(*replaced_cargo_malloc)(0x38), user == (cargo_validation_t *)0x0
     )) {
    user = (cargo_validation_t *)calloc(1,0x38);
    if (user == (cargo_validation_t *)0x0) {
      return (cargo_validation_t *)0x0;
    }
  }
  else {
    user->ref_count = 0;
    user->user = (void *)0x0;
    user->destroy = (cargo_validation_destroy_f)0x0;
    *(undefined8 *)&user->types = 0;
    user->name = (char *)0x0;
    user->validator = (cargo_validation_f)0x0;
    user[1].name = (char *)0x0;
  }
  __ptr_00 = cargo_create_validator
                       ("choices",_cargo_validate_choices_cb,_cargo_validate_choices_destroy_cb,
                        CARGO_ULONGLONG|CARGO_LONGLONG|CARGO_STRING|CARGO_DOUBLE|CARGO_FLOAT|
                        CARGO_UINT|CARGO_INT,user);
  if (__ptr_00 != (cargo_validation_t *)0x0) {
    *(cargo_validate_choices_flags_t *)&user->user = flags;
    *(cargo_type_t *)&user->name = type;
    user->validator = (cargo_validation_f)count;
    p_Var3 = (cargo_validation_destroy_f)_cargo_calloc(count,8);
    if (type == CARGO_STRING) {
      user->destroy = p_Var3;
    }
    else {
      *(cargo_validation_destroy_f *)&user->types = p_Var3;
    }
    if (p_Var3 != (cargo_validation_destroy_f)0x0) {
      local_108.s = &user[1].name;
      local_108.l = count * 0x14;
      local_128 = 0x3000000018;
      local_120 = &ap[0].overflow_arg_area;
      if (((ulong)user->user & 2) == 0) {
        uStack_b4 = 0x3c32725d;
        uVar11 = 0xd1d243ac;
      }
      else {
        local_128 = 0x4000000018;
        uVar11 = local_b8;
      }
      user->ref_count = CONCAT44(uStack_b4,uVar11);
      if (user->validator == (cargo_validation_f)0x0) {
        return __ptr_00;
      }
      p_Var10 = (cargo_validation_f)0x0;
      do {
        iVar1 = *(int *)&user->name;
        if (iVar1 < 0x10) {
          if (iVar1 == 2) {
            uVar8 = local_128 & 0xffffffff;
            if (uVar8 < 0x29) {
              local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
              ppvVar5 = (void **)((long)local_e8 + uVar8);
            }
            else {
              ppvVar5 = local_120;
              local_120 = local_120 + 1;
            }
            *(undefined4 *)(*(long *)&user->types + (long)p_Var10 * 8) = *(undefined4 *)ppvVar5;
            uVar2 = *(uint *)(*(long *)&user->types + (long)p_Var10 * 8);
            pcVar4 = "%d";
          }
          else {
            if (iVar1 != 4) {
              if (iVar1 != 8) goto LAB_0010a0a5;
              uVar8 = (ulong)local_128._4_4_;
              if (uVar8 < 0xa1) {
                local_128 = CONCAT44(local_128._4_4_ + 0x10,(int)local_128);
                ppvVar5 = (void **)((long)local_e8 + uVar8);
              }
              else {
                ppvVar5 = local_120;
                local_120 = local_120 + 1;
              }
              *(float *)(*(long *)&user->types + (long)p_Var10 * 8) = (float)(double)*ppvVar5;
              uVar11 = SUB84((double)*(float *)(*(long *)&user->types + (long)p_Var10 * 8),0);
              goto LAB_0010a065;
            }
            uVar8 = local_128 & 0xffffffff;
            if (uVar8 < 0x29) {
              local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
              ppvVar5 = (void **)((long)local_e8 + uVar8);
            }
            else {
              ppvVar5 = local_120;
              local_120 = local_120 + 1;
            }
            *(undefined4 *)(*(long *)&user->types + (long)p_Var10 * 8) = *(undefined4 *)ppvVar5;
            uVar2 = *(uint *)(*(long *)&user->types + (long)p_Var10 * 8);
            pcVar4 = "%u";
          }
          cargo_aappendf(&local_108,pcVar4,(ulong)uVar2);
        }
        else if (iVar1 < 0x40) {
          if (iVar1 == 0x10) {
            uVar8 = (ulong)local_128._4_4_;
            if (uVar8 < 0xa1) {
              local_128 = CONCAT44(local_128._4_4_ + 0x10,(int)local_128);
              ppvVar5 = (void **)((long)local_e8 + uVar8);
            }
            else {
              ppvVar5 = local_120;
              local_120 = local_120 + 1;
            }
            *(void **)(*(long *)&user->types + (long)p_Var10 * 8) = *ppvVar5;
            uVar11 = (undefined4)*(undefined8 *)(*(long *)&user->types + (long)p_Var10 * 8);
LAB_0010a065:
            cargo_aappendf(&local_108,"%.2f",uVar11);
          }
          else if (iVar1 == 0x20) {
            uVar8 = local_128 & 0xffffffff;
            if (uVar8 < 0x29) {
              local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
              ppvVar5 = (void **)((long)local_e8 + uVar8);
            }
            else {
              ppvVar5 = local_120;
              local_120 = local_120 + 1;
            }
            pcVar4 = _cargo_strdup((char *)*ppvVar5);
            *(char **)(user->destroy + (long)p_Var10 * 8) = pcVar4;
            if (pcVar4 != (char *)0x0) {
              uVar9 = *(undefined8 *)(user->destroy + (long)p_Var10 * 8);
              pcVar4 = "%s";
              goto LAB_0010a030;
            }
            break;
          }
        }
        else {
          if (iVar1 == 0x40) {
            uVar8 = local_128 & 0xffffffff;
            if (uVar8 < 0x29) {
              local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
              ppvVar5 = (void **)((long)local_e8 + uVar8);
            }
            else {
              ppvVar5 = local_120;
              local_120 = local_120 + 1;
            }
            *(void **)(*(long *)&user->types + (long)p_Var10 * 8) = *ppvVar5;
            uVar9 = *(undefined8 *)(*(long *)&user->types + (long)p_Var10 * 8);
            pcVar4 = "%lld";
          }
          else {
            if (iVar1 != 0x80) goto LAB_0010a0a5;
            uVar8 = local_128 & 0xffffffff;
            if (uVar8 < 0x29) {
              local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
              ppvVar5 = (void **)((long)local_e8 + uVar8);
            }
            else {
              ppvVar5 = local_120;
              local_120 = local_120 + 1;
            }
            *(void **)(*(long *)&user->types + (long)p_Var10 * 8) = *ppvVar5;
            uVar9 = *(undefined8 *)(*(long *)&user->types + (long)p_Var10 * 8);
            pcVar4 = "%llu";
          }
LAB_0010a030:
          cargo_aappendf(&local_108,pcVar4,uVar9);
        }
LAB_0010a0a5:
        p_Var10 = p_Var10 + 1;
        p_Var6 = user->validator;
        if (p_Var10 < p_Var6) {
          cargo_aappendf(&local_108,", ");
          p_Var6 = user->validator;
        }
        if (p_Var6 <= p_Var10) {
          return __ptr_00;
        }
      } while( true );
    }
    p_Var3 = user->destroy;
    p_Var7 = replaced_cargo_free;
    if (p_Var3 != (cargo_validation_destroy_f)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(p_Var3);
        p_Var7 = (cargo_free_f)0x0;
      }
      else {
        (*replaced_cargo_free)(p_Var3);
        p_Var7 = replaced_cargo_free;
      }
      user->destroy = (cargo_validation_destroy_f)0x0;
    }
    __ptr = *(void **)&user->types;
    if (__ptr != (void *)0x0) {
      if (p_Var7 == (cargo_free_f)0x0) {
        free(__ptr);
        p_Var7 = (cargo_free_f)0x0;
      }
      else {
        (*p_Var7)(__ptr);
        p_Var7 = replaced_cargo_free;
      }
      *(undefined8 *)&user->types = 0;
    }
    pcVar4 = user[1].name;
    if (pcVar4 != (char *)0x0) {
      if (p_Var7 == (cargo_free_f)0x0) {
        free(pcVar4);
        p_Var7 = (cargo_free_f)0x0;
      }
      else {
        (*p_Var7)(pcVar4);
        p_Var7 = replaced_cargo_free;
      }
      user[1].name = (char *)0x0;
    }
    if (p_Var7 == (cargo_free_f)0x0) {
      free(user);
      goto LAB_0010a174;
    }
    (*p_Var7)(user);
    user = __ptr_00;
  }
  __ptr_00 = user;
  if (replaced_cargo_free != (cargo_free_f)0x0) {
    (*replaced_cargo_free)(__ptr_00);
    return (cargo_validation_t *)0x0;
  }
LAB_0010a174:
  free(__ptr_00);
  return (cargo_validation_t *)0x0;
}

Assistant:

cargo_validation_t *cargo_validate_choices(cargo_validate_choices_flags_t flags,
                                            cargo_type_t type,
                                            size_t count, ...)
{
    va_list ap;
    size_t i;
    cargo_astr_t str;
    cargo_validation_t *v = NULL;
    cargo_choices_validation_t *vc = NULL;
    memset(&str, 0, sizeof(str));

    if (!(vc = _cargo_calloc(1, sizeof(cargo_choices_validation_t))))
    {
        return NULL;
    }

    if (!(v = cargo_create_validator("choices",
                _cargo_validate_choices_cb,
                _cargo_validate_choices_destroy_cb,
                (CARGO_STRING | CARGO_INT | CARGO_UINT | CARGO_FLOAT |
                 CARGO_DOUBLE | CARGO_LONGLONG | CARGO_ULONGLONG),
                vc)))
    {
        _cargo_free(vc);
        return NULL;
    }

    vc->flags = flags;
    vc->type = type;
    vc->count = count;

    if (vc->type == CARGO_STRING)
    {
        if (!(vc->strs = _cargo_calloc(vc->count, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory\n");
            goto fail;
        }
    }
    else
    {
        if (!(vc->nums = _cargo_calloc(vc->count, sizeof(cargo_vals_t))))
        {
            CARGODBG(1, "Out of memory\n");
            goto fail;
        }
    }

    // Start out with room strings of 20 chars
    // to keep reallocation to a minimum.
    str.s = &vc->err;
    str.l = count * 20;

    va_start(ap, count);

    if (vc->flags & CARGO_VALIDATE_CHOICES_SET_EPSILON)
    {
        vc->epsilon = va_arg(ap, double);
    }
    else
    {
        vc->epsilon = CARGO_DEFAULT_EPSILON;
    }

    for (i = 0; i < vc->count; i++)
    {
        switch (vc->type)
        {
            case CARGO_STRING:
            {
                if (!(vc->strs[i] = _cargo_strdup(va_arg(ap, char *))))
                {
                    goto fail;
                }

                cargo_aappendf(&str, "%s", vc->strs[i]);
                break;
            }
            case CARGO_INT:
            {
                vc->nums[i].i = va_arg(ap, int);
                cargo_aappendf(&str, "%d", vc->nums[i].i);
                break;
            }
            case CARGO_UINT:
            {
                vc->nums[i].u = va_arg(ap, unsigned int);
                cargo_aappendf(&str, "%u", vc->nums[i].u);
                break;
            }
            case CARGO_FLOAT:
            {
                vc->nums[i].f = (float)va_arg(ap, double);
                cargo_aappendf(&str, "%.2f", vc->nums[i].f);
                break;
            }
            case CARGO_DOUBLE:
            {
                vc->nums[i].d = va_arg(ap, double);
                cargo_aappendf(&str, "%.2f", vc->nums[i].d);
                break;
            }
            case CARGO_LONGLONG:
            {
                vc->nums[i].ll = va_arg(ap, long long int);
                cargo_aappendf(&str, "%"CARGO_LONGLONG_FMT, vc->nums[i].ll);
                break;
            }
            case CARGO_ULONGLONG:
            {
                vc->nums[i].ull = va_arg(ap, unsigned long long int);
                cargo_aappendf(&str, "%"CARGO_ULONGLONG_FMT, vc->nums[i].ull);
                break;
            }
            default:
                break;
        }

        if (i + 1 < vc->count)
        {
            cargo_aappendf(&str, ", ");
        }
    }

    va_end(ap);

    return v;
fail:
    _cargo_xfree(&vc->strs);
    _cargo_xfree(&vc->nums);
    _cargo_xfree(&vc->err);
    _cargo_free(vc);
    _cargo_free(v);
    return NULL;
}